

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O1

bool Imf_3_4::anon_unknown_0::checkCoreFile(exr_context_t f,bool reduceMemory,bool reduceTime)

{
  short sVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  pointer puVar8;
  long lVar9;
  bool bVar10;
  int iVar11;
  long lVar12;
  undefined7 in_register_00000031;
  size_type sVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  byte bVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  char cVar22;
  bool bVar23;
  bool bVar24;
  int32_t curtw;
  int32_t lines_per_chunk;
  exr_storage_t store;
  int32_t curth;
  exr_tile_level_mode_t levelmode;
  vector<unsigned_char,_std::allocator<unsigned_char>_> imgdata;
  int numparts;
  int32_t levh;
  int32_t levw;
  int32_t levelsy;
  int32_t levelsx;
  exr_attr_box2i_t datawin;
  exr_tile_round_mode_t roundingmode;
  uint32_t tysz;
  exr_chunk_info_t cinfo;
  exr_decode_pipeline_t decoder;
  int local_2e0;
  uint local_2dc;
  int local_2d8;
  uint local_2d4;
  int local_2d0;
  int local_2cc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2c8;
  uint local_2ac;
  int local_2a8;
  int local_2a4;
  int local_2a0;
  int local_29c;
  int local_298;
  int local_294;
  ulong local_290;
  int local_288;
  int local_284;
  int local_280;
  int local_27c;
  long local_278;
  undefined1 local_270 [4];
  undefined1 local_26c [4];
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  long local_220;
  short local_218;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_1b8;
  code *local_130;
  
  local_2dc = (uint)CONCAT71(in_register_00000031,reduceMemory);
  iVar2 = exr_get_count(f,&local_2a4);
  bVar10 = true;
  if ((iVar2 == 0) && (bVar10 = 0 < local_2a4, 0 < local_2a4)) {
    local_2a8 = (uint)!reduceTime * 2 + 5;
    local_2dc = local_2dc ^ 1;
    local_2ac = (uint)!reduceTime * 2 + 2;
    iVar2 = 0;
    do {
      iVar3 = exr_get_storage(f,iVar2,&local_2d4);
      if (iVar3 != 0) {
        return bVar10;
      }
      if ((local_2d4 & 0xfffffffd) == 1) {
        iVar3 = exr_get_data_window(f,iVar2,&local_288);
        if (iVar3 != 0) {
          return bVar10;
        }
        iVar3 = exr_get_tile_descriptor(f,iVar2,&local_2d8,local_26c,&local_2cc,local_270);
        if (iVar3 != 0) {
          return bVar10;
        }
        iVar3 = exr_get_tile_levels(f,iVar2,&local_294,&local_298);
        if (iVar3 != 0) {
          return bVar10;
        }
        if (0 < local_298) {
          bVar24 = true;
          iVar3 = 0;
          uVar16 = 0;
          do {
            if ((bVar24) && (0 < local_294)) {
              iVar20 = 0;
              do {
                uVar6 = exr_get_level_sizes(f,iVar2,iVar20,iVar3,&local_29c,&local_2a0);
                if ((uVar6 == 0) &&
                   (uVar6 = exr_get_tile_sizes(f,iVar2,iVar20,iVar3,&local_2e0,&local_2d0),
                   uVar6 == 0)) {
                  local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  memset(&local_228,0,0x1f8);
                  local_228 = 0x1f8;
                  if ((bVar24) && (0 < local_2a0)) {
                    lVar12 = 0;
                    iVar18 = 0;
                    local_290 = 0;
                    do {
                      local_278 = lVar12;
                      if ((bVar24) && (0 < local_29c)) {
                        lVar12 = 0;
                        iVar11 = 0;
                        do {
                          uVar6 = exr_read_tile_chunk_info
                                            (f,iVar2,iVar11,iVar18,iVar20,iVar3,&local_268);
                          if (uVar6 == 0) {
                            if (local_220 == 0) {
                              uVar7 = exr_decoding_initialize(f,iVar2,&local_268);
                              if ((int)uVar7 == 0) {
                                if (local_218 < 1) {
                                  sVar13 = 0;
                                }
                                else {
                                  uVar7 = 0x28;
                                  lVar15 = 0;
                                  sVar13 = 0;
                                  do {
                                    *(size_type *)(local_220 + uVar7) = sVar13 + 0x1000;
                                    sVar1 = *(short *)(local_220 + -0xc + uVar7);
                                    *(int *)(local_220 + -8 + uVar7) = (int)sVar1;
                                    *(int *)(local_220 + -4 + uVar7) = local_2e0 * sVar1;
                                    sVar13 = (long)local_2d0 * (long)local_2e0 * (long)sVar1 +
                                             sVar13;
                                    lVar15 = lVar15 + 1;
                                    uVar7 = uVar7 + 0x30;
                                  } while (lVar15 < local_218);
                                }
                                bVar17 = sVar13 < 1000000 | (byte)local_2dc;
                                local_290 = CONCAT71((int7)(uVar7 >> 8),bVar17);
                                if (local_258._6_1_ == '\x03') {
                                  local_1b8 = &local_2c8;
                                  local_130 = realloc_deepdata;
                                }
                                else if (bVar17 != 0) {
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                            (&local_2c8,sVar13);
                                }
                                uVar6 = exr_decoding_choose_default_routines(f,iVar2,&local_228);
                                if (uVar6 == 0) goto LAB_00111fe9;
                                uVar16 = (ulong)uVar6;
                                bVar24 = false;
                              }
                              else {
LAB_0011208c:
                                bVar24 = false;
                                uVar16 = uVar7 & 0xffffffff;
                              }
                              break;
                            }
                            uVar7 = exr_decoding_update(f,iVar2,&local_268,&local_228);
                            if ((int)uVar7 == 0) {
LAB_00111fe9:
                              if ((local_290 & 1) != 0) {
                                if ((local_258._6_1_ != '\x03') && (0 < local_218)) {
                                  lVar15 = 0x28;
                                  lVar19 = 0;
                                  puVar8 = local_2c8.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                                  do {
                                    *(pointer *)(local_220 + lVar15) = puVar8;
                                    sVar1 = *(short *)(local_220 + -0xc + lVar15);
                                    *(int *)(local_220 + -8 + lVar15) = (int)sVar1;
                                    *(int *)(local_220 + -4 + lVar15) = local_2e0 * sVar1;
                                    puVar8 = puVar8 + (long)local_2d0 * (long)local_2e0 *
                                                      (long)sVar1;
                                    lVar19 = lVar19 + 1;
                                    lVar15 = lVar15 + 0x30;
                                  } while (lVar19 < local_218);
                                }
                                uVar7 = exr_decoding_run(f,iVar2,&local_228);
                                bVar23 = (int)uVar7 != 0;
                                if (bVar23) {
                                  uVar16 = uVar7 & 0xffffffff;
                                }
                                if (reduceTime && bVar23) goto LAB_0011208c;
                              }
                            }
                            else {
                              if (reduceTime) goto LAB_0011208c;
                              uVar16 = uVar7 & 0xffffffff;
                            }
                          }
                          else {
                            if (iVar20 == iVar3) {
                              uVar16 = (ulong)uVar6;
                            }
                            if (local_2cc == 2) {
                              uVar16 = (ulong)uVar6;
                            }
                            if (reduceTime) {
                              bVar24 = false;
                              break;
                            }
                          }
                          if (!bVar24) break;
                          lVar12 = lVar12 + local_2e0;
                          iVar11 = iVar11 + 1;
                        } while (lVar12 < local_29c);
                      }
                      if (!bVar24) break;
                      lVar12 = local_278 + local_2d0;
                      iVar18 = iVar18 + 1;
                    } while (lVar12 < local_2a0);
                  }
                  exr_decoding_destroy(f,&local_228);
                  if (local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_2c8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_2c8.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_2c8.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  iVar18 = 0;
                }
                else {
                  if (iVar20 == iVar3) {
                    uVar16 = (ulong)uVar6;
                  }
                  if (local_2cc == 2) {
                    uVar16 = (ulong)uVar6;
                  }
                  iVar18 = local_2a8;
                  if (reduceTime) {
                    bVar24 = false;
                  }
                }
              } while ((((iVar18 == 7) || (iVar18 == 0)) && (bVar24)) &&
                      (iVar20 = iVar20 + 1, iVar20 < local_294));
            }
          } while ((bVar24) && (iVar3 = iVar3 + 1, iVar3 < local_298));
          bVar24 = (int)uVar16 == 0;
          goto LAB_00112151;
        }
      }
      else if ((local_2d4 & 0xfffffffd) == 0) {
        iVar3 = exr_get_data_window(f,iVar2,&local_288);
        if (iVar3 != 0) {
          return bVar10;
        }
        lVar12 = (long)local_280;
        lVar19 = (long)local_288;
        lVar21 = (long)local_27c;
        lVar15 = (long)local_284;
        local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        memset(&local_228,0,0x1f8);
        local_228 = 0x1f8;
        iVar3 = exr_get_scanlines_per_chunk(f,iVar2,&local_2d8);
        cVar22 = '\x01';
        if (iVar3 == 0) {
          uVar6 = 0;
          if (lVar21 + 1 != lVar15) {
            lVar12 = (lVar12 - lVar19) + 1;
            uVar16 = 0;
            bVar17 = 0;
            do {
              local_238 = 0;
              uStack_230 = 0;
              local_248 = 0;
              uStack_240 = 0;
              local_258 = 0;
              uStack_250 = 0;
              local_268 = 0;
              uStack_260 = 0;
              uVar4 = exr_read_scanline_chunk_info(f,iVar2,local_284 + (int)uVar16,&local_268);
              uVar5 = local_2ac;
              if (uVar4 == 0) {
                if (local_220 == 0) {
                  iVar3 = exr_decoding_initialize(f,iVar2,&local_268,&local_228);
                  uVar4 = uVar6;
                  uVar5 = 2;
                  if (iVar3 == 0) {
                    if (local_218 < 1) {
                      sVar13 = 0;
                    }
                    else {
                      lVar19 = 0x28;
                      lVar9 = 0;
                      sVar13 = 0;
                      do {
                        *(undefined8 *)(local_220 + lVar19) = 0x1000;
                        sVar1 = *(short *)(local_220 + -0xc + lVar19);
                        *(int *)(local_220 + -8 + lVar19) = (int)sVar1;
                        lVar14 = sVar1 * lVar12;
                        *(int *)(local_220 + -4 + lVar19) = (int)lVar14;
                        sVar13 = sVar13 + local_2d8 * lVar14;
                        lVar9 = lVar9 + 1;
                        lVar19 = lVar19 + 0x30;
                      } while (lVar9 < local_218);
                    }
                    bVar17 = sVar13 < 8000000 | (byte)local_2dc;
                    if (local_258._6_1_ == '\x02') {
                      local_1b8 = &local_2c8;
                      local_130 = realloc_deepdata;
                    }
                    else if (bVar17 != 0) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_2c8,sVar13);
                    }
                    uVar4 = exr_decoding_choose_default_routines(f,iVar2,&local_228);
                    bVar24 = uVar4 != 0;
                    if (!bVar24) goto LAB_00111b05;
LAB_00111c8e:
                    uVar5 = (uint)bVar24 * 2;
                  }
                }
                else {
                  uVar4 = exr_decoding_update(f,iVar2,&local_268);
                  uVar5 = local_2ac;
                  if (uVar4 == 0) {
LAB_00111b05:
                    uVar4 = uVar6;
                    uVar5 = 0;
                    if ((bVar17 & 1) != 0) {
                      if ((local_258._6_1_ != '\x02') && (0 < local_218)) {
                        lVar19 = 0x28;
                        lVar9 = 0;
                        puVar8 = local_2c8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
                        do {
                          *(pointer *)(local_220 + lVar19) = puVar8;
                          sVar1 = *(short *)(local_220 + -0xc + lVar19);
                          *(int *)(local_220 + -8 + lVar19) = (int)sVar1;
                          lVar14 = sVar1 * lVar12;
                          *(int *)(local_220 + -4 + lVar19) = (int)lVar14;
                          puVar8 = puVar8 + local_2d8 * lVar14;
                          lVar9 = lVar9 + 1;
                          lVar19 = lVar19 + 0x30;
                        } while (lVar9 < local_218);
                      }
                      uVar5 = exr_decoding_run(f,iVar2,&local_228);
                      if (uVar5 != 0) {
                        uVar4 = uVar5;
                      }
                      bVar24 = uVar5 != 0 && reduceTime;
                      goto LAB_00111c8e;
                    }
                  }
                }
              }
            } while (((uVar5 & 3) == 0) &&
                    (uVar16 = uVar16 + (long)local_2d8, uVar6 = uVar4,
                    uVar16 < (ulong)((lVar21 + 1) - lVar15)));
            uVar6 = (uint)(uVar4 != 0);
          }
          cVar22 = (char)uVar6;
          exr_decoding_destroy(f,&local_228);
        }
        if (local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2c8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_2c8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2c8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        bVar24 = cVar22 == '\0';
LAB_00112151:
        if (!bVar24) {
          return bVar10;
        }
      }
      iVar2 = iVar2 + 1;
      bVar10 = iVar2 < local_2a4;
    } while (iVar2 < local_2a4);
  }
  return bVar10;
}

Assistant:

bool
checkCoreFile (exr_context_t f, bool reduceMemory, bool reduceTime)
{
    exr_result_t rv;
    int          numparts;

    rv = exr_get_count (f, &numparts);
    if (rv != EXR_ERR_SUCCESS) return true;

    for (int p = 0; p < numparts; ++p)
    {
        exr_storage_t store;
        rv = exr_get_storage (f, p, &store);
        if (rv != EXR_ERR_SUCCESS) return true;

        if (store == EXR_STORAGE_SCANLINE || store == EXR_STORAGE_DEEP_SCANLINE)
        {
            if (readCoreScanlinePart (f, p, reduceMemory, reduceTime))
                return true;
        }
        else if (store == EXR_STORAGE_TILED || store == EXR_STORAGE_DEEP_TILED)
        {
            if (readCoreTiledPart (f, p, reduceMemory, reduceTime)) return true;
        }
    }

    return false;
}